

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__pnm_getinteger(stbi__context *s,char *c)

{
  stbi_uc sVar1;
  int iVar2;
  undefined8 *puVar3;
  int iVar4;
  
  iVar4 = 0;
  do {
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001cafec:
      if (s->img_buffer_end <= s->img_buffer) {
        return iVar4;
      }
    }
    else {
      iVar2 = (*(s->io).eof)(s->io_user_data);
      if (iVar2 != 0) {
        if (s->read_from_callbacks == 0) {
          return iVar4;
        }
        goto LAB_001cafec;
      }
    }
    if ((byte)(*c - 0x3aU) < 0xf6) {
      return iVar4;
    }
    iVar4 = (uint)(byte)*c + iVar4 * 10 + -0x30;
    sVar1 = stbi__get8(s);
    *c = sVar1;
    if ((0xccccccc < iVar4) || ('7' < (char)sVar1 && iVar4 == 0xccccccc)) {
      puVar3 = (undefined8 *)__tls_get_addr(&PTR_001f4f18);
      *puVar3 = "Parsing an integer in the PPM header overflowed a 32-bit int";
      return 0;
    }
  } while( true );
}

Assistant:

static int      stbi__pnm_getinteger(stbi__context *s, char *c)
{
   int value = 0;

   while (!stbi__at_eof(s) && stbi__pnm_isdigit(*c)) {
      value = value*10 + (*c - '0');
      *c = (char) stbi__get8(s);
      if((value > 214748364) || (value == 214748364 && *c > '7'))
          return stbi__err("integer parse overflow", "Parsing an integer in the PPM header overflowed a 32-bit int");
   }

   return value;
}